

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::
write_int<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::int_writer<unsigned_int,fmt::v6::basic_format_specs<wchar_t>>::num_writer>
          (basic_writer<fmt::v6::buffer_range<wchar_t>> *this,int num_digits,string_view prefix,
          format_specs specs,num_writer f)

{
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>_>::int_writer<unsigned_int,_fmt::v6::basic_format_specs<wchar_t>_>::num_writer>
  local_60;
  
  local_60.prefix.size_ = prefix.size_;
  local_60.prefix.data_ = prefix.data_;
  uVar2 = (uint)num_digits + local_60.prefix.size_;
  local_60.fill = specs.fill.data_[0];
  if ((specs._9_1_ & 0xf) == 4) {
    uVar1 = (ulong)(uint)specs.width;
    local_60.size_ = uVar2;
    local_60.padding = 0;
    if (uVar2 <= uVar1) {
      local_60.size_ = uVar1;
      local_60.padding = uVar1 - uVar2;
    }
  }
  else {
    local_60.padding = 0;
    uVar3 = specs.precision - num_digits;
    if (uVar3 != 0 && num_digits <= specs.precision) {
      local_60.fill = L'0';
    }
    if (uVar3 != 0 && num_digits <= specs.precision) {
      uVar2 = (uint)specs.precision + local_60.prefix.size_;
      local_60.padding = (ulong)uVar3;
    }
    local_60.size_ = uVar2;
    if (((undefined1  [36])specs & (undefined1  [36])0xf00) == (undefined1  [36])0x0) {
      specs._9_1_ = specs._9_1_ | 2;
    }
  }
  local_60.f.abs_value = f.abs_value;
  local_60.f.size = f.size;
  local_60.f.groups = f.groups;
  local_60.f.sep = f.sep;
  write_padded<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::int_writer<unsigned_int,fmt::v6::basic_format_specs<wchar_t>>::num_writer>>
            (this,&specs,&local_60);
  return;
}

Assistant:

void write_int(int num_digits, string_view prefix, format_specs specs, F f) {
    std::size_t size = prefix.size() + to_unsigned(num_digits);
    char_type fill = specs.fill[0];
    std::size_t padding = 0;
    if (specs.align == align::numeric) {
      auto unsiged_width = to_unsigned(specs.width);
      if (unsiged_width > size) {
        padding = unsiged_width - size;
        size = unsiged_width;
      }
    } else if (specs.precision > num_digits) {
      size = prefix.size() + to_unsigned(specs.precision);
      padding = to_unsigned(specs.precision - num_digits);
      fill = static_cast<char_type>('0');
    }
    if (specs.align == align::none) specs.align = align::right;
    write_padded(specs, padded_int_writer<F>{size, prefix, fill, padding, f});
  }